

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

Abc_Obj_t * Abc_AigAndLookup(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1)

{
  Abc_Obj_t *pAVar1;
  int *piVar2;
  void **ppvVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  uint uVar8;
  
  pAVar5 = (Abc_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
  if ((Abc_Aig_t *)pAVar5->pNtk->pManFunc != pMan) {
    __assert_fail("Abc_ObjRegular(p0)->pNtk->pManFunc == pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                  ,0x197,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar7 = (Abc_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
  if ((Abc_Aig_t *)pAVar7->pNtk->pManFunc == pMan) {
    if (pMan->pNtkAig->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                    ,0x2ad,"Abc_Obj_t *Abc_AigConst1(Abc_Ntk_t *)");
    }
    pAVar6 = p0;
    if (p0 != p1) {
      pAVar1 = *(Abc_Obj_t **)((long)pMan->pNtkAig->pManFunc + 8);
      if ((Abc_Obj_t *)((ulong)p1 ^ 1) == p0) {
        pAVar6 = (Abc_Obj_t *)((ulong)pAVar1 ^ 1);
      }
      else if (pAVar1 == pAVar5) {
        pAVar6 = p1;
        if (pAVar5 != p0) {
          pAVar6 = (Abc_Obj_t *)((ulong)p0 | 1);
        }
      }
      else if (pAVar1 == pAVar7) {
        if (pAVar7 != p1) {
          pAVar6 = (Abc_Obj_t *)((ulong)p1 | 1);
        }
      }
      else {
        pAVar6 = (Abc_Obj_t *)0x0;
        if (((pAVar5->vFanouts).nSize != 0) && ((pAVar7->vFanouts).nSize != 0)) {
          pAVar6 = p0;
          if (pAVar7->Id < pAVar5->Id) {
            pAVar6 = p1;
            p1 = p0;
          }
          uVar8 = 0x38f;
          if (((ulong)pAVar6 & 1) == 0) {
            uVar8 = 0;
          }
          uVar4 = 0x161;
          if (((ulong)p1 & 1) == 0) {
            uVar4 = 0;
          }
          for (pAVar5 = pMan->pBins
                        [(ulong)(uVar4 ^ uVar8 ^
                                *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10) * 0xb9b ^
                                *(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x10) * 0x1f01) %
                         (ulong)(uint)pMan->nBins]; pAVar5 != (Abc_Obj_t *)0x0;
              pAVar5 = pAVar5->pNext) {
            piVar2 = (pAVar5->vFanins).pArray;
            ppvVar3 = pAVar5->pNtk->vObjs->pArray;
            if ((pAVar6 == (Abc_Obj_t *)
                           ((ulong)(*(uint *)&pAVar5->field_0x14 >> 10 & 1) ^
                           (ulong)ppvVar3[*piVar2])) &&
               (p1 == (Abc_Obj_t *)
                      ((ulong)(*(uint *)&pAVar5->field_0x14 >> 0xb & 1) ^ (ulong)ppvVar3[piVar2[1]])
               )) {
              return pAVar5;
            }
          }
          pAVar6 = (Abc_Obj_t *)0x0;
        }
      }
    }
    return pAVar6;
  }
  __assert_fail("Abc_ObjRegular(p1)->pNtk->pManFunc == pMan",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                ,0x198,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_AigAndLookup( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1 )
{
    Abc_Obj_t * pAnd, * pConst1;
    unsigned Key;
    assert( Abc_ObjRegular(p0)->pNtk->pManFunc == pMan );
    assert( Abc_ObjRegular(p1)->pNtk->pManFunc == pMan );
    // check for trivial cases
    pConst1 = Abc_AigConst1(pMan->pNtkAig);
    if ( p0 == p1 )
        return p0;
    if ( p0 == Abc_ObjNot(p1) )
        return Abc_ObjNot(pConst1);
    if ( Abc_ObjRegular(p0) == pConst1 )
    {
        if ( p0 == pConst1 )
            return p1;
        return Abc_ObjNot(pConst1);
    }
    if ( Abc_ObjRegular(p1) == pConst1 )
    {
        if ( p1 == pConst1 )
            return p0;
        return Abc_ObjNot(pConst1);
    }
/*
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            pMan->nStrash0++;
        else if ( nFans0 == 1 || nFans1 == 1 )
            pMan->nStrash1++;
        else if ( nFans0 <= 100 && nFans1 <= 100 )
            pMan->nStrash5++;
        else
            pMan->nStrash2++;
    }
*/
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            return NULL;
    }

    // order the arguments
    if ( Abc_ObjRegular(p0)->Id > Abc_ObjRegular(p1)->Id )
        pAnd = p0, p0 = p1, p1 = pAnd;
    // get the hash key for these two nodes
    Key = Abc_HashKey2( p0, p1, pMan->nBins );
    // find the matching node in the table
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
        if ( p0 == Abc_ObjChild0(pAnd) && p1 == Abc_ObjChild1(pAnd) )
        {
//            assert( Abc_ObjFanoutNum(Abc_ObjRegular(p0)) && Abc_ObjFanoutNum(p1) );
             return pAnd;
        }
    return NULL;
}